

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O2

void __thiscall ncnn::Requantize::Requantize(Requantize *this)

{
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Requantize_005673e8;
  (this->bias_data).cstep = 0;
  (this->activation_params).data = (void *)0x0;
  (this->activation_params).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->activation_params).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->activation_params).elemsize + 4) = 0;
  (this->activation_params).allocator = (Allocator *)0x0;
  (this->activation_params).dims = 0;
  (this->activation_params).w = 0;
  (this->activation_params).w = 0;
  (this->activation_params).h = 0;
  (this->activation_params).d = 0;
  (this->activation_params).c = 0;
  (this->activation_params).cstep = 0;
  (this->scale_in_data).data = (void *)0x0;
  (this->scale_in_data).refcount = (int *)0x0;
  (this->scale_in_data).elemsize = 0;
  (this->scale_in_data).elempack = 0;
  (this->scale_in_data).allocator = (Allocator *)0x0;
  (this->scale_in_data).dims = 0;
  (this->scale_in_data).w = 0;
  (this->scale_in_data).w = 0;
  (this->scale_in_data).h = 0;
  (this->scale_in_data).d = 0;
  (this->scale_in_data).c = 0;
  (this->scale_out_data).elempack = 0;
  (this->scale_in_data).cstep = 0;
  (this->scale_out_data).data = (void *)0x0;
  (this->scale_out_data).refcount = (int *)0x0;
  (this->scale_out_data).elemsize = 0;
  (this->scale_out_data).allocator = (Allocator *)0x0;
  (this->scale_out_data).dims = 0;
  (this->scale_out_data).w = 0;
  (this->scale_out_data).w = 0;
  (this->scale_out_data).h = 0;
  (this->scale_out_data).d = 0;
  (this->scale_out_data).c = 0;
  (this->scale_out_data).cstep = 0;
  (this->bias_data).data = (void *)0x0;
  (this->bias_data).elempack = 0;
  (this->bias_data).refcount = (int *)0x0;
  (this->bias_data).elemsize = 0;
  (this->bias_data).w = 0;
  (this->bias_data).h = 0;
  (this->bias_data).d = 0;
  (this->bias_data).c = 0;
  (this->bias_data).allocator = (Allocator *)0x0;
  (this->bias_data).dims = 0;
  (this->bias_data).w = 0;
  (this->super_Layer).one_blob_only = true;
  (this->super_Layer).support_inplace = false;
  return;
}

Assistant:

Requantize::Requantize()
{
    one_blob_only = true;
    support_inplace = false;
}